

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O1

void __thiscall spatial_region::scale_j(spatial_region *this,double scale)

{
  cellj *pcVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 in_register_00001208 [56];
  undefined1 auVar16 [64];
  
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = scale;
  if (0 < (long)this->nx) {
    auVar7 = vpbroadcastq_avx512f();
    auVar8 = vbroadcastsd_avx512f(auVar8._0_16_);
    lVar5 = 0;
    auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar10 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar11 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      if (0 < this->ny) {
        uVar6 = 0;
        do {
          if (0 < this->nz) {
            pcVar1 = (this->cj).p._M_t.
                     super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                     super__Head_base<0UL,_cellj_***,_false>._M_head_impl[lVar5][uVar6];
            auVar12 = vpbroadcastq_avx512f();
            auVar13 = vmovdqa64_avx512f(auVar9);
            uVar4 = (ulong)(this->nz + 7U & 0xfffffff8);
            do {
              uVar3 = vpcmpuq_avx512f(auVar13,auVar7,2);
              auVar14 = vpmullq_avx512dq(auVar13,auVar10);
              auVar15 = vpaddq_avx512f(auVar12,auVar14);
              auVar16 = vgatherqpd_avx512f(*(undefined8 *)((long)&this->nx + (long)pcVar1));
              bVar2 = (byte)uVar3;
              auVar17._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar16._8_8_;
              auVar17._0_8_ = (ulong)(bVar2 & 1) * auVar16._0_8_;
              auVar17._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar16._16_8_;
              auVar17._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar16._24_8_;
              auVar17._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar16._32_8_;
              auVar17._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar16._40_8_;
              auVar17._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar16._48_8_;
              auVar17._56_8_ = (uVar3 >> 7) * auVar16._56_8_;
              auVar16 = vmulpd_avx512f(auVar17,auVar8);
              vscatterqpd_avx512f(ZEXT864(pcVar1) + auVar14,uVar3,auVar16);
              auVar14 = vgatherqpd_avx512f(*(undefined8 *)(lVar5 + 8));
              auVar16._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar14._8_8_;
              auVar16._0_8_ = (ulong)(bVar2 & 1) * auVar14._0_8_;
              auVar16._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar14._16_8_;
              auVar16._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar14._24_8_;
              auVar16._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar14._32_8_;
              auVar16._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar14._40_8_;
              auVar16._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar14._48_8_;
              auVar16._56_8_ = (uVar3 >> 7) * auVar14._56_8_;
              auVar14 = vmulpd_avx512f(auVar16,auVar8);
              vscatterqpd_avx512f(ZEXT864(8) + auVar15,uVar3,auVar14);
              auVar14 = vgatherqpd_avx512f(*(undefined8 *)(lVar5 + 0x10));
              auVar18._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar14._8_8_;
              auVar18._0_8_ = (ulong)(bVar2 & 1) * auVar14._0_8_;
              auVar18._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar14._16_8_;
              auVar18._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar14._24_8_;
              auVar18._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar14._32_8_;
              auVar18._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar14._40_8_;
              auVar18._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar14._48_8_;
              auVar18._56_8_ = (uVar3 >> 7) * auVar14._56_8_;
              auVar14 = vmulpd_avx512f(auVar18,auVar8);
              vscatterqpd_avx512f(ZEXT864(0x10) + auVar15,uVar3,auVar14);
              auVar13 = vpaddq_avx512f(auVar13,auVar11);
              uVar4 = uVar4 - 8;
            } while (uVar4 != 0);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uint)this->ny);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != this->nx);
  }
  return;
}

Assistant:

void spatial_region::scale_j(const double scale) {
    for (int i = 0; i < nx; i++) {
        for (int j = 0; j < ny; j++) {
            for (int k = 0; k < nz; k++) {
                cj[i][j][k].jx *= scale;
                cj[i][j][k].jy *= scale;
                cj[i][j][k].jz *= scale;
            }
        }
    }
}